

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *bitlen;
  uint *puVar10;
  long lVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  bool bVar17;
  size_t local_130;
  uint *local_128;
  uint *local_120;
  uchar *local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  uint local_f8;
  uint local_f4;
  ulong local_f0;
  uint local_e4;
  ucvector v;
  HuffmanTree tree_ll;
  HuffmanTree local_78;
  HuffmanTree local_58;
  
  v.data = *out;
  v.size = *outsize;
  uVar13 = 0;
  local_130 = 0;
  local_110 = insize * 8;
  uVar6 = 0;
  local_118 = in;
  v.allocsize = v.size;
  do {
    puVar3 = local_118;
    sVar2 = local_130;
    if (uVar6 != 0) {
      uVar7 = 0;
      break;
    }
    uVar14 = local_130 + 2;
    if (local_110 <= uVar14) {
LAB_0033b6aa:
      uVar7 = 0x34;
      break;
    }
    uVar15 = local_130 + 3;
    local_f4 = (uint)local_118[local_130 >> 3];
    bVar4 = (local_118[uVar14 >> 3] >> ((byte)uVar14 & 7)) * '\x02' & 2 |
            (local_118[local_130 + 1 >> 3] >> ((uint)(local_130 + 1) & 7) & 1) != 0;
    if (bVar4 == 0) {
      uVar14 = uVar15 + (5U - (int)local_130 & 7) >> 3;
      if (insize <= uVar14 + 4) goto LAB_0033b6aa;
      uVar6 = (uint)*(ushort *)(local_118 + uVar14);
      if (*(ushort *)(local_118 + uVar14 + 2) + uVar6 != 0xffff) {
        uVar7 = 0x15;
        break;
      }
      local_130 = uVar15;
      uVar7 = ucvector_resize(&v,uVar13 + uVar6);
      if (uVar7 == 0) {
        uVar7 = 0x53;
        break;
      }
      if (insize < uVar14 + 4 + (ulong)uVar6) {
        uVar7 = 0x17;
        break;
      }
      local_130 = uVar14 * 8 + 0x20;
      for (lVar11 = 0; uVar6 != (uint)lVar11; lVar11 = lVar11 + 1) {
        local_130 = local_130 + 8;
        v.data[uVar13] = in[lVar11 + uVar14 + 4];
        uVar13 = uVar13 + 1;
      }
      uVar7 = 0;
    }
    else {
      if (bVar4 == 3) {
        uVar7 = 0x14;
        break;
      }
      tree_ll.lengths = (uint *)0x0;
      local_78.lengths = (uint *)0x0;
      tree_ll.tree2d = (uint *)0x0;
      tree_ll.tree1d = (uint *)0x0;
      local_78.tree2d = (uint *)0x0;
      local_78.tree1d = (uint *)0x0;
      if (bVar4 == 2) {
        uVar14 = local_130 + 0x11;
        uVar7 = 0x31;
        local_130 = uVar15;
        if (uVar14 <= local_110) {
          uVar6 = readBitsFromStream(&local_130,local_118,5);
          local_100 = CONCAT44(extraout_var,uVar6);
          uVar6 = readBitsFromStream(&local_130,puVar3,5);
          local_108 = CONCAT44(extraout_var_00,uVar6);
          uVar6 = readBitsFromStream(&local_130,puVar3,4);
          uVar7 = 0x32;
          if ((uVar6 + 4) * 3 + local_130 <= local_110) {
            local_58.lengths = (uint *)0x0;
            local_58.tree2d = (uint *)0x0;
            local_58.tree1d = (uint *)0x0;
            bitlen = (uint *)malloc(0x4c);
            if (bitlen == (uint *)0x0) {
              uVar7 = 0x53;
              puVar10 = (uint *)0x0;
              puVar16 = (uint *)0x0;
            }
            else {
              puVar16 = CLCL_ORDER;
              local_f8 = (int)local_100 + 0x101;
              local_108 = (ulong)((int)local_108 + 1);
              for (uVar14 = 0; uVar14 != 0x13; uVar14 = uVar14 + 1) {
                uVar7 = 0;
                if (uVar14 < uVar6 + 4) {
                  uVar7 = readBitsFromStream(&local_130,local_118,3);
                }
                uVar8 = *puVar16;
                puVar16 = puVar16 + 1;
                bitlen[uVar8] = uVar7;
              }
              uVar7 = HuffmanTree_makeFromLengths(&local_58,bitlen,0x13,7);
              if (uVar7 == 0) {
                puVar10 = (uint *)malloc(0x480);
                puVar16 = (uint *)malloc(0x80);
                if (puVar16 == (uint *)0x0 || puVar10 == (uint *)0x0) {
                  uVar7 = 0x53;
                }
                else {
                  for (lVar11 = 0; lVar11 != 0x120; lVar11 = lVar11 + 1) {
                    puVar10[lVar11] = 0;
                  }
                  for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
                    puVar16[lVar11] = 0;
                  }
                  uVar14 = 0;
                  uVar7 = 0;
                  local_108 = (ulong)((int)local_108 + local_f8);
                  iVar1 = (int)local_100;
                  local_e4 = iVar1 + 0x102;
                  local_f0 = (ulong)local_f8;
                  local_100 = (ulong)(-iVar1 - 0x101);
                  local_128 = puVar16;
                  local_120 = puVar10;
LAB_0033b1fb:
                  uVar14 = uVar14 & 0xffffffff;
                  puVar12 = local_120 + uVar14;
                  while( true ) {
                    uVar6 = (uint)uVar14;
                    if ((uint)local_108 <= uVar6) {
                      puVar10 = local_120;
                      puVar16 = local_128;
                      if (uVar7 == 0) {
                        if (local_120[0x100] == 0) {
                          uVar7 = 0x40;
                        }
                        else {
                          uVar7 = HuffmanTree_makeFromLengths(&tree_ll,local_120,0x120,0xf);
                          puVar16 = local_128;
                          puVar10 = local_120;
                          if (uVar7 == 0) {
                            uVar7 = HuffmanTree_makeFromLengths(&local_78,local_128,0x20,0xf);
                            puVar10 = local_120;
                          }
                        }
                      }
                      goto LAB_0033b3ed;
                    }
                    uVar8 = huffmanDecodeSymbol(local_118,&local_130,&local_58,local_110);
                    if (0xf < uVar8) break;
                    uVar9 = local_f8;
                    puVar16 = local_128;
                    if (uVar6 < local_f8) {
                      uVar9 = 0;
                      puVar16 = local_120;
                    }
                    uVar14 = uVar14 + 1;
                    puVar12 = puVar12 + 1;
                    puVar16[uVar6 - uVar9] = uVar8;
                  }
                  puVar16 = local_128;
                  puVar10 = local_120;
                  if (uVar8 != 0x10) {
                    if (uVar8 == 0x11) {
                      if (local_110 < local_130 + 3) goto LAB_0033b673;
                      uVar6 = readBitsFromStream(&local_130,local_118,3);
                      iVar5 = uVar6 + 3;
                      while (bVar17 = iVar5 != 0, iVar5 = iVar5 + -1, bVar17) {
                        if (local_108 == uVar14) {
                          uVar7 = 0xe;
                          break;
                        }
                        puVar16 = local_128 + (uint)((int)local_100 + (int)uVar14);
                        if (uVar14 < local_f0) {
                          puVar16 = puVar12;
                        }
                        uVar14 = uVar14 + 1;
                        puVar12 = puVar12 + 1;
                        *puVar16 = 0;
                      }
                    }
                    else {
                      if (uVar8 != 0x12) {
                        if (uVar8 == 0xffffffff) {
                          uVar7 = 0xb - (local_110 < local_130);
                        }
                        else {
                          uVar7 = 0x10;
                        }
                        goto LAB_0033b3ed;
                      }
                      if (local_110 < local_130 + 7) goto LAB_0033b673;
                      uVar6 = readBitsFromStream(&local_130,local_118,7);
                      iVar5 = uVar6 + 0xb;
                      while (bVar17 = iVar5 != 0, iVar5 = iVar5 + -1, bVar17) {
                        if (local_108 == uVar14) {
                          uVar7 = 0xf;
                          break;
                        }
                        puVar16 = local_128 + (uint)((int)local_100 + (int)uVar14);
                        if (uVar14 < local_f0) {
                          puVar16 = puVar12;
                        }
                        uVar14 = uVar14 + 1;
                        puVar12 = puVar12 + 1;
                        *puVar16 = 0;
                      }
                    }
                    goto LAB_0033b1fb;
                  }
                  if (uVar6 == 0) {
                    uVar7 = 0x36;
                    goto LAB_0033b3ed;
                  }
                  if (local_130 + 2 <= local_110) {
                    uVar8 = readBitsFromStream(&local_130,local_118,2);
                    iVar5 = uVar8 + 3;
                    puVar16 = local_128 + ((-0x102 - iVar1) + uVar6);
                    if (uVar6 < local_e4) {
                      puVar16 = local_120 + (uVar6 - 1);
                    }
                    uVar6 = *puVar16;
                    while (bVar17 = iVar5 != 0, iVar5 = iVar5 + -1, bVar17) {
                      if (local_108 == uVar14) {
                        uVar7 = 0xd;
                        break;
                      }
                      puVar16 = local_128 + (uint)((int)local_100 + (int)uVar14);
                      if (uVar14 < local_f0) {
                        puVar16 = puVar12;
                      }
                      uVar14 = uVar14 + 1;
                      puVar12 = puVar12 + 1;
                      *puVar16 = uVar6;
                    }
                    goto LAB_0033b1fb;
                  }
LAB_0033b673:
                  uVar7 = 0x32;
                }
              }
              else {
                puVar10 = (uint *)0x0;
                puVar16 = (uint *)0x0;
              }
            }
LAB_0033b3ed:
            free(bitlen);
            free(puVar10);
            free(puVar16);
            HuffmanTree_cleanup(&local_58);
          }
        }
      }
      else {
        uVar7 = 0;
        local_130 = uVar15;
        if (bVar4 == 1) {
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&local_78);
        }
      }
      while (uVar14 = local_110, uVar7 == 0) {
        uVar6 = huffmanDecodeSymbol(local_118,&local_130,&tree_ll,local_110);
        puVar3 = local_118;
        if (uVar6 < 0x100) {
          uVar7 = ucvector_resize(&v,uVar13 + 1);
          if (uVar7 == 0) {
            uVar7 = 0x53;
            break;
          }
          uVar7 = 0;
          v.data[uVar13] = (uchar)uVar6;
          uVar13 = uVar13 + 1;
        }
        else {
          if ((uVar6 == 0x100) || (0x11d < uVar6)) {
            uVar7 = 0;
            if (uVar6 != 0x100) {
              uVar7 = 0xb - (local_110 < local_130);
            }
            break;
          }
          if (uVar14 < local_130 + LENGTHEXTRA[uVar6 - 0x101]) {
            uVar7 = 0x33;
            break;
          }
          uVar7 = LENGTHBASE[uVar6 - 0x101];
          uVar6 = readBitsFromStream(&local_130,local_118,(ulong)LENGTHEXTRA[uVar6 - 0x101]);
          uVar8 = huffmanDecodeSymbol(puVar3,&local_130,&local_78,uVar14);
          if (0x1d < uVar8) {
            uVar7 = 0x12;
            break;
          }
          if (uVar14 < local_130 + DISTANCEEXTRA[uVar8]) {
            uVar7 = 0x33;
            break;
          }
          uVar9 = readBitsFromStream(&local_130,local_118,(ulong)DISTANCEEXTRA[uVar8]);
          uVar14 = (ulong)(uVar9 + DISTANCEBASE[uVar8]);
          if (uVar13 < uVar14) {
            uVar7 = 0x34;
            break;
          }
          uVar15 = (ulong)uVar6 + (ulong)uVar7;
          uVar6 = ucvector_resize(&v,uVar15 + uVar13);
          if (uVar6 == 0) {
            uVar7 = 0x53;
            break;
          }
          if (uVar14 < uVar15) {
            while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
              v.data[uVar13] = v.data[uVar13 - uVar14];
              uVar13 = uVar13 + 1;
            }
            uVar7 = 0;
          }
          else {
            memcpy(v.data + uVar13,v.data + (uVar13 - uVar14),uVar15);
            uVar7 = 0;
            uVar13 = uVar15 + uVar13;
          }
        }
      }
      HuffmanTree_cleanup(&tree_ll);
      HuffmanTree_cleanup(&local_78);
    }
    uVar6 = local_f4 >> ((byte)sVar2 & 7) & 1;
  } while (uVar7 == 0);
  *out = v.data;
  *outsize = v.size;
  return uVar7;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}